

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_cmp_int(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  mbedtls_mpi_sint in_RSI;
  mbedtls_mpi *in_RDI;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_28;
  mbedtls_mpi local_20;
  mbedtls_mpi_sint local_10;
  mbedtls_mpi *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = mpi_sint_abs(in_RSI);
  local_20.s = (short)(local_10 >> 0x3f) * 2 + 1;
  local_20.n = 1;
  local_20.p = &local_28;
  iVar1 = mbedtls_mpi_cmp_mpi(local_8,&local_20);
  return iVar1;
}

Assistant:

int mbedtls_mpi_cmp_int(const mbedtls_mpi *X, mbedtls_mpi_sint z)
{
    mbedtls_mpi Y;
    mbedtls_mpi_uint p[1];

    *p  = mpi_sint_abs(z);
    Y.s = TO_SIGN(z);
    Y.n = 1;
    Y.p = p;

    return mbedtls_mpi_cmp_mpi(X, &Y);
}